

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

bool __thiscall
MeCab::Writer::writeNode(Writer *this,Lattice *lattice,char *p,Node *node,StringBuffer *os)

{
  float *__n;
  char *pcVar1;
  char cVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  char *__dest;
  undefined8 *puVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar10;
  unsigned_short *puVar11;
  uint uVar12;
  size_t sVar13;
  ulong __n_00;
  Node *pNVar14;
  float *pfVar15;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar16;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  uchar *extraout_RDX_07;
  uchar *extraout_RDX_08;
  uchar *extraout_RDX_09;
  uchar *extraout_RDX_10;
  uchar *extraout_RDX_11;
  uchar *extraout_RDX_12;
  uchar *extraout_RDX_13;
  uchar *extraout_RDX_14;
  uchar *extraout_RDX_15;
  uchar *extraout_RDX_16;
  uchar *extraout_RDX_17;
  uchar *extraout_RDX_18;
  uchar *extraout_RDX_19;
  uint *puVar17;
  uchar *extraout_RDX_20;
  uchar *extraout_RDX_21;
  uchar *extraout_RDX_22;
  char *pcVar18;
  char *pcVar19;
  long n;
  char *pcVar20;
  undefined8 *puVar21;
  byte *pbVar22;
  char *pcVar23;
  mecab_path_t *pmVar24;
  string error;
  undefined1 *local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  unsigned_short *local_70;
  unsigned_short *local_68;
  float *local_60;
  unsigned_short *local_58;
  float *local_50;
  Node *local_48;
  Node *local_40;
  Node *local_38;
  void *__buf;
  
  __dest = (char *)operator_new__(0x2000);
  puVar9 = (undefined8 *)operator_new__(0x200);
  bVar4 = *p;
  if (bVar4 == 0) {
LAB_00156510:
    bVar6 = true;
LAB_00156539:
    operator_delete__(puVar9);
    operator_delete__(__dest);
    return bVar6;
  }
  local_70 = &node->rcAttr;
  local_68 = &node->lcAttr;
  local_58 = &node->rlength;
  local_60 = &node->beta;
  local_50 = &node->alpha;
  __n = &node->prob;
  puVar17 = (uint *)&node->stat;
  local_40 = (Node *)&node->char_type;
  local_a8 = (undefined1 *)0x0;
  local_48 = (Node *)puVar17;
LAB_00155d38:
  if (bVar4 != 0x25) {
    if (bVar4 == 0x5c) {
      bVar4 = ((byte *)p)[1];
      sVar13 = (size_t)bVar4;
      bVar5 = 0;
      if (bVar4 < 0x66) {
        if (bVar4 == 0x5c) {
          bVar5 = 0x5c;
        }
        else if (bVar4 == 0x61) {
          bVar5 = 7;
        }
        else if (bVar4 == 0x62) {
          bVar5 = 8;
        }
      }
      else {
        puVar17 = (uint *)(ulong)(bVar4 - 0x6e);
        bVar5 = 0;
        if (bVar4 - 0x6e < 9) {
          sVar13 = (long)&switchD_00155d6e::switchdataD_001825b4 +
                   (long)(int)(&switchD_00155d6e::switchdataD_001825b4)[(long)puVar17];
          switch(puVar17) {
          case (uint *)0x0:
            bVar5 = 10;
            break;
          case (uint *)0x4:
            bVar5 = 0xd;
            break;
          case (uint *)0x5:
            bVar5 = 0x20;
            break;
          case (uint *)0x6:
            bVar5 = 9;
            break;
          case (uint *)0x8:
            bVar5 = 0xb;
          }
        }
        else if (bVar4 == 0x66) {
          bVar5 = 0xc;
        }
      }
      StringBuffer::write(os,(uint)bVar5,puVar17,sVar13);
      pbVar22 = (byte *)p + 1;
      puVar17 = (uint *)extraout_RDX_01;
    }
    else {
      StringBuffer::write(os,(int)(char)bVar4,puVar17,(ulong)bVar4);
      puVar17 = (uint *)extraout_RDX_00;
      pbVar22 = (byte *)p;
    }
    goto LAB_00155eb6;
  }
  pbVar22 = (byte *)p + 1;
  bVar4 = ((byte *)p)[1];
  if (0x62 < bVar4) {
    uVar12 = bVar4 - 0x66;
    if (0xe < uVar12) {
      if (bVar4 != 99) goto switchD_00155d9f_caseD_47;
      StringBuffer::operator<<(os,(int)node->wcost);
      puVar17 = (uint *)extraout_RDX_03;
      goto LAB_00155eb6;
    }
    puVar16 = (uchar *)((long)&switchD_00155df0::switchdataD_001824d8 +
                       (long)(int)(&switchD_00155df0::switchdataD_001824d8)[uVar12]);
    pNVar14 = local_40;
    switch((uint)bVar4) {
    case 0x66:
      goto switchD_00155d9f_caseD_46;
    default:
      goto switchD_00155d9f_caseD_47;
    case 0x68:
      StringBuffer::operator<<(os,node->posid);
      puVar17 = (uint *)extraout_RDX_07;
      break;
    case 0x6d:
      iVar7 = (int)node->surface;
      __buf = (void *)(ulong)node->length;
      goto LAB_00155fee;
    case 0x70:
      pbVar22 = (byte *)p + 2;
      bVar4 = ((byte *)p)[2];
      if (bVar4 < 0x50) {
        if (bVar4 < 0x43) {
          pfVar15 = local_50;
          if ((bVar4 == 0x41) || (pfVar15 = local_60, bVar4 == 0x42)) goto LAB_0015628f;
        }
        else {
          if (bVar4 == 0x43) {
            n = node->cost - ((long)node->wcost + node->prev->cost);
            goto LAB_00156335;
          }
          puVar11 = local_58;
          if (bVar4 == 0x4c) goto switchD_00155f6a_caseD_6c;
        }
switchD_00155f6a_caseD_64:
        pcVar18 = "[iseSCwcnblLh] is required after %p";
        goto LAB_00156564;
      }
      uVar12 = bVar4 - 0x62;
      if (0x15 < uVar12) {
        pfVar15 = __n;
        if (bVar4 == 0x50) {
LAB_0015628f:
          StringBuffer::operator<<(os,(double)*pfVar15);
          puVar17 = (uint *)extraout_RDX_14;
        }
        else {
          if (bVar4 != 0x53) goto switchD_00155f6a_caseD_64;
          StringBuffer::write(os,((int)node->surface - (uint)node->rlength) + (uint)node->length,
                              (void *)((ulong)node->rlength - (ulong)node->length),(size_t)__n);
          puVar17 = (uint *)extraout_RDX_13;
        }
        break;
      }
      sVar13 = (long)&switchD_00155f6a::switchdataD_00182538 +
               (long)(int)(&switchD_00155f6a::switchdataD_00182538)[uVar12];
      puVar11 = &node->length;
      switch((uint)bVar4) {
      case 0x62:
        iVar7 = 0x2a;
        if (node->isbest == '\0') {
          iVar7 = 0x20;
        }
        StringBuffer::write(os,iVar7,puVar16,sVar13);
        puVar17 = (uint *)extraout_RDX_05;
        break;
      case 99:
        n = node->cost;
        goto LAB_00156335;
      default:
        goto switchD_00155f6a_caseD_64;
      case 0x65:
        pcVar18 = node->surface;
        iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
        iVar7 = (uint)node->length + ((int)pcVar18 - iVar7);
        goto LAB_0015637e;
      case 0x68:
        puVar11 = local_68;
        if ((((byte *)p)[3] != 0x6c) && (puVar11 = local_70, ((byte *)p)[3] != 0x72)) {
          pcVar18 = "lr is required after %ph";
          goto LAB_00156564;
        }
        StringBuffer::operator<<(os,*puVar11);
        pbVar22 = (byte *)p + 3;
        puVar17 = (uint *)extraout_RDX_16;
        break;
      case 0x69:
        StringBuffer::operator<<(os,node->id);
        puVar17 = (uint *)extraout_RDX_19;
        break;
      case 0x6c:
switchD_00155f6a_caseD_6c:
        StringBuffer::operator<<(os,*puVar11);
        puVar17 = (uint *)extraout_RDX_12;
        break;
      case 0x6e:
        n = node->cost - node->prev->cost;
LAB_00156335:
        StringBuffer::operator<<(os,n);
        puVar17 = (uint *)extraout_RDX_17;
        break;
      case 0x70:
        bVar4 = ((byte *)p)[4];
        puVar17 = (uint *)puVar16;
        if (bVar4 == 0x5c) {
          pbVar22 = (byte *)p + 5;
          bVar5 = ((byte *)p)[5];
          bVar4 = 0;
          if (bVar5 < 0x66) {
            if (bVar5 == 0x5c) {
              bVar4 = 0x5c;
            }
            else if (bVar5 == 0x61) {
              bVar4 = 7;
            }
            else if (bVar5 == 0x62) {
              bVar4 = 8;
            }
          }
          else {
            sVar13 = (size_t)(bVar5 - 0x6e);
            puVar17 = &switchD_001563e4::switchdataD_00182590;
            bVar4 = 0;
            switch(sVar13) {
            case 0:
              bVar4 = 10;
              break;
            case 1:
            case 2:
            case 3:
            case 7:
              break;
            case 4:
              bVar4 = 0xd;
              break;
            case 5:
              bVar4 = 0x20;
              break;
            case 6:
              bVar4 = 9;
              break;
            case 8:
              bVar4 = 0xb;
              break;
            default:
              puVar17 = (uint *)puVar16;
              if (bVar5 == 0x66) {
                bVar4 = 0xc;
              }
            }
          }
        }
        else {
          pbVar22 = (byte *)p + 4;
        }
        pmVar24 = node->lpath;
        if (pmVar24 == (mecab_path_t *)0x0) {
          (*lattice->_vptr_Lattice[0x25])(lattice,"no path information is available");
          goto LAB_0015658d;
        }
        bVar5 = ((byte *)p)[3];
        do {
          if (pmVar24 != node->lpath) {
            StringBuffer::write(os,(int)(char)bVar4,puVar17,sVar13);
          }
          if (bVar5 == 0x50) {
            StringBuffer::operator<<(os,(double)pmVar24->prob);
            puVar17 = (uint *)extraout_RDX_22;
          }
          else if (bVar5 == 99) {
            StringBuffer::operator<<(os,pmVar24->cost);
            puVar17 = (uint *)extraout_RDX_21;
          }
          else {
            if (bVar5 != 0x69) {
              (*lattice->_vptr_Lattice[0x25])(lattice,"[icP] is required after %pp");
              goto LAB_00156537;
            }
            StringBuffer::operator<<(os,pmVar24->lnode->id);
            puVar17 = (uint *)extraout_RDX_20;
          }
          pmVar24 = pmVar24->lnext;
        } while (pmVar24 != (mecab_path_t *)0x0);
        break;
      case 0x73:
        pcVar18 = node->surface;
        iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
        iVar7 = (int)pcVar18 - iVar7;
LAB_0015637e:
        StringBuffer::operator<<(os,iVar7);
        puVar17 = (uint *)extraout_RDX_18;
        break;
      case 0x77:
        StringBuffer::operator<<(os,node->wcost);
        puVar17 = (uint *)extraout_RDX_15;
      }
      break;
    case 0x73:
      pNVar14 = local_48;
    case 0x74:
      StringBuffer::operator<<(os,(uint)*(byte *)&pNVar14->prev);
      puVar17 = (uint *)extraout_RDX_09;
    }
    goto LAB_00155eb6;
  }
  __n_00 = (ulong)(bVar4 - 0x46);
  if (0xd < bVar4 - 0x46) {
    if (bVar4 != 0x25) goto switchD_00155d9f_caseD_47;
    StringBuffer::write(os,0x25,puVar17,__n_00);
    puVar17 = (uint *)extraout_RDX_02;
    goto LAB_00155eb6;
  }
  pNVar14 = (Node *)((long)&switchD_00155d9f::switchdataD_001824a0 +
                    (long)(int)(&switchD_00155d9f::switchdataD_001824a0)[__n_00]);
  switch(__n_00) {
  case 0:
switchD_00155d9f_caseD_46:
    if (*node->feature != '\0') {
      puVar3 = local_a8;
      if (local_a8 == (undefined1 *)0x0) {
        strncpy(__dest,node->feature,0x2000);
        sVar13 = strlen(__dest);
        if ((long)sVar13 < 1) {
          local_a8 = (undefined1 *)0x0;
          puVar3 = local_a8;
        }
        else {
          pcVar19 = __dest + sVar13;
          local_a8 = (undefined1 *)0x0;
          pcVar18 = __dest;
          puVar21 = puVar9;
          pNVar14 = (Node *)0x40;
          do {
            for (; (local_38 = pNVar14, cVar2 = *pcVar18, cVar2 == '\t' || (cVar2 == ' '));
                pcVar18 = pcVar18 + 1) {
              pNVar14 = local_38;
            }
            if (cVar2 == '\"') {
              pcVar18 = pcVar18 + 1;
              pcVar23 = pcVar18;
              for (pcVar10 = pcVar18;
                  (pcVar20 = pcVar10, pcVar10 < pcVar19 &&
                  ((cVar2 = *pcVar10, cVar2 != '\"' ||
                   (pcVar20 = pcVar10 + 1, pcVar1 = pcVar10 + 1, pcVar10 = pcVar20, *pcVar1 == '\"')
                   ))); pcVar10 = pcVar10 + 1) {
                *pcVar23 = cVar2;
                pcVar23 = pcVar23 + 1;
              }
              local_90[0] = (undefined1 *)CONCAT71(local_90[0]._1_7_,0x2c);
              pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pcVar20,pcVar19,local_90);
            }
            else {
              local_90[0] = (undefined1 *)CONCAT71(local_90[0]._1_7_,0x2c);
              pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (pcVar18,pcVar19,local_90);
              pcVar23 = pcVar10;
            }
            pNVar14 = (Node *)((long)&local_38[-1].cost + 7);
            if (local_38 < (Node *)0x2) {
              *puVar21 = pcVar18;
              puVar3 = local_a8 + 1;
              if (pNVar14 == (Node *)0x0) break;
            }
            else {
              *pcVar23 = '\0';
              *puVar21 = pcVar18;
            }
            local_a8 = local_a8 + 1;
            puVar21 = puVar21 + 1;
            pcVar18 = pcVar10 + 1;
            puVar3 = local_a8;
          } while (pcVar18 < pcVar19);
        }
      }
      local_a8 = puVar3;
      bVar4 = 9;
      if (*pbVar22 == 0x46) {
        bVar4 = ((byte *)p)[2];
        if (bVar4 == 0x5c) {
          bVar5 = ((byte *)p)[3];
          pbVar22 = (byte *)p + 3;
          bVar4 = 0;
          if (bVar5 < 0x66) {
            if (bVar5 == 0x5c) {
              bVar4 = 0x5c;
            }
            else if (bVar5 == 0x61) {
              bVar4 = 7;
            }
            else if (bVar5 == 0x62) {
              bVar4 = 8;
            }
          }
          else {
            pNVar14 = (Node *)(ulong)(bVar5 - 0x6e);
            bVar4 = 0;
            switch(pNVar14) {
            case (Node *)0x0:
              bVar4 = 10;
              break;
            case (Node *)0x1:
            case (Node *)0x2:
            case (Node *)0x3:
            case (Node *)0x7:
              break;
            case (Node *)0x4:
              bVar4 = 0xd;
              break;
            case (Node *)0x5:
              bVar4 = 0x20;
              break;
            case (Node *)0x6:
              bVar4 = 9;
              break;
            case (Node *)0x8:
              bVar4 = 0xb;
              break;
            default:
              if (bVar5 == 0x66) {
                bVar4 = 0xc;
              }
            }
          }
        }
        else {
          pbVar22 = (byte *)p + 2;
        }
      }
      if (pbVar22[1] == 0x5b) {
        pbVar22 = pbVar22 + 2;
        puVar16 = (uchar *)0x0;
        bVar6 = false;
        while( true ) {
          bVar5 = *pbVar22;
          pNVar14 = (Node *)CONCAT71((int7)((ulong)pNVar14 >> 8),bVar5);
          puVar17 = (uint *)(ulong)bVar5;
          if (9 < bVar5 - 0x30) break;
          pNVar14 = (Node *)((long)puVar16 * 5);
          puVar16 = (uchar *)((long)puVar17 + (long)puVar16 * 10 + -0x30);
LAB_00156171:
          pbVar22 = pbVar22 + 1;
        }
        if ((bVar5 == 0x2c) || (bVar5 == 0x5d)) {
          if (puVar16 < local_a8) {
            pcVar18 = (char *)puVar9[(long)puVar16];
            cVar2 = *pcVar18;
            if (cVar2 != '*') {
              if (bVar6) {
                StringBuffer::write(os,(int)(char)bVar4,puVar17,(size_t)pNVar14);
                pcVar18 = (char *)puVar9[(long)puVar16];
                puVar17 = (uint *)extraout_RDX_10;
              }
              StringBuffer::write(os,(int)pcVar18,puVar17,(size_t)pNVar14);
              pNVar14 = (Node *)CONCAT71((int7)((ulong)pNVar14 >> 8),*pbVar22);
              puVar17 = (uint *)extraout_RDX_11;
            }
            if ((char)pNVar14 != ']') {
              puVar16 = (uchar *)0x0;
              bVar6 = cVar2 != '*';
              goto LAB_00156171;
            }
            break;
          }
          pcVar18 = "given index is out of range";
        }
        else {
          pcVar18 = "cannot find \']\'";
        }
        (*lattice->_vptr_Lattice[0x25])(lattice,pcVar18);
        goto LAB_00156537;
      }
      (*lattice->_vptr_Lattice[0x25])(lattice,"cannot find \'[\'");
LAB_0015658d:
      bVar6 = false;
      goto LAB_00156539;
    }
    pcVar18 = "no feature information available";
LAB_00156564:
    (*lattice->_vptr_Lattice[0x25])(lattice,pcVar18);
    goto LAB_00156537;
  default:
switchD_00155d9f_caseD_47:
    pcVar18 = "unknown meta char: " + (char)bVar4;
    local_90[0] = local_80;
    sVar13 = strlen(pcVar18);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,pcVar18,pcVar18 + sVar13);
    (*lattice->_vptr_Lattice[0x25])(lattice,local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
LAB_00156537:
    bVar6 = false;
    goto LAB_00156539;
  case 2:
    StringBuffer::write(os,(int)node->feature,&switchD_00155d9f::switchdataD_001824a0,
                        (size_t)pNVar14);
    puVar17 = (uint *)extraout_RDX;
    break;
  case 6:
    iVar7 = (*lattice->_vptr_Lattice[0xb])(lattice);
    StringBuffer::operator<<(os,CONCAT44(extraout_var,iVar7));
    puVar17 = (uint *)extraout_RDX_06;
    break;
  case 7:
    __buf = (void *)(ulong)node->rlength;
    iVar7 = (uint)node->length + ((int)node->surface - (uint)node->rlength);
    pNVar14 = node;
    goto LAB_00155fee;
  case 10:
    StringBuffer::operator<<(os,(double)*__n);
    puVar17 = (uint *)extraout_RDX_04;
    break;
  case 0xd:
    iVar7 = (*lattice->_vptr_Lattice[8])(lattice);
    iVar8 = (*lattice->_vptr_Lattice[0xb])(lattice);
    __buf = (void *)CONCAT44(extraout_var_00,iVar8);
LAB_00155fee:
    StringBuffer::write(os,iVar7,__buf,(size_t)pNVar14);
    puVar17 = (uint *)extraout_RDX_08;
  }
LAB_00155eb6:
  bVar4 = pbVar22[1];
  p = (char *)(pbVar22 + 1);
  if (bVar4 == 0) goto LAB_00156510;
  goto LAB_00155d38;
}

Assistant:

bool Writer::writeNode(Lattice *lattice,
                       const char *p,
                       const Node *node,
                       StringBuffer *os) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, 64> ptr;
  size_t psize = 0;

  for (; *p; p++) {
    switch (*p) {
      default: *os << *p; break;

      case '\\': *os << getEscapedChar(*++p); break;

      case '%': {  // macros
        switch (*++p) {
          default: {
            const std::string error = "unknown meta char: " + *p;
            lattice->set_what(error.c_str());
            return false;
          }
            // input sentence
          case 'S': os->write(lattice->sentence(), lattice->size()); break;
            // sentence length
          case 'L': *os << lattice->size(); break;
            // morph
          case 'm': os->write(node->surface, node->length); break;
          case 'M': os->write(reinterpret_cast<const char *>
                              (node->surface - node->rlength + node->length),
                              node->rlength);
            break;
          case 'h': *os << node->posid; break;  // Part-Of-Speech ID
          case '%': *os << '%'; break;         // %
          case 'c': *os << static_cast<int>(node->wcost); break;  // word cost
          case 'H': *os << node->feature; break;
          case 't': *os << static_cast<unsigned int>(node->char_type); break;
          case 's': *os << static_cast<unsigned int>(node->stat); break;
          case 'P': *os << node->prob; break;
          case 'p': {
            switch (*++p) {
              default:
                lattice->set_what("[iseSCwcnblLh] is required after %p");
                return false;
              case 'i': *os << node->id; break;  // node id
              case 'S': os->write(reinterpret_cast<const char*>
                                  (node->surface -
                                   node->rlength + node->length),
                                  node->rlength - node->length);
                break;  // space
                // start position
              case 's': *os << static_cast<int>(
                  node->surface - lattice->sentence());
                break;
                // end position
              case 'e': *os << static_cast<int>
                    (node->surface - lattice->sentence() + node->length);
                break;
                // connection cost
              case 'C': *os << node->cost -
                    node->prev->cost - node->wcost;
                break;
              case 'w': *os << node->wcost; break;  // word cost
              case 'c': *os << node->cost; break;  // best cost
              case 'n': *os << (node->cost - node->prev->cost); break;
                // node cost
                // * if best path, otherwise ' '
              case 'b': *os << (node->isbest ? '*' : ' '); break;
              case 'P': *os << node->prob; break;
              case 'A': *os << node->alpha; break;
              case 'B': *os << node->beta; break;
              case 'l': *os << node->length; break;  // length of morph
                // length of morph including the spaces
              case 'L': *os << node->rlength;    break;
              case 'h': {  // Hidden Layer ID
                switch (*++p) {
                  default:
                    lattice->set_what("lr is required after %ph");
                    return false;
                  case 'l': *os << node->lcAttr; break;   // current
                  case 'r': *os << node->rcAttr; break;   // prev
                }
              } break;

              case 'p': {
                char mode = *++p;
                char sep = *++p;
                if (sep == '\\') {
                  sep = getEscapedChar(*++p);
                }
                if (!node->lpath) {
                  lattice->set_what("no path information is available");
                  return false;
                }
                for (Path *path = node->lpath; path; path = path->lnext) {
                  if (path != node->lpath) *os << sep;
                  switch (mode) {
                    case 'i': *os << path->lnode->id; break;
                    case 'c': *os << path->cost; break;
                    case 'P': *os << path->prob; break;
                    default:
                      lattice->set_what("[icP] is required after %pp");
                      return false;
                  }
                }
              } break;

            }
          } break;

          case 'F':
          case 'f': {
            if (node->feature[0] == '\0') {
              lattice->set_what("no feature information available");
              return false;
            }
            if (!psize) {
              std::strncpy(buf.get(), node->feature, buf.size());
              psize = tokenizeCSV(buf.get(), ptr.get(), ptr.size());
            }

            // separator
            char separator = '\t';  // default separator
            if (*p == 'F') {  // change separator
              if (*++p == '\\') {
                separator = getEscapedChar(*++p);
              } else {
                separator = *p;
              }
            }

            if (*++p !='[') {
              lattice->set_what("cannot find '['");
              return false;
            }
            size_t n = 0;
            bool sep = false;
            bool isfil = false;
            p++;

            for (;; ++p) {
              switch (*p) {
                case '0': case '1': case '2': case '3': case '4':
                case '5': case '6': case '7': case '8': case '9':
                  n = 10 * n +(*p - '0');
                  break;
                case ',': case ']':
                  if (n >= psize) {
                    lattice->set_what("given index is out of range");
                    return false;
                  }
                  isfil = (ptr[n][0] != '*');
                  if (isfil) {
                    if (sep) {
                      *os << separator;
                    }
                    *os << ptr[n];
                  }
                  if (*p == ']') {
                    goto last;
                  }
                  sep = isfil;
                  n = 0;
                  break;
                default:
                  lattice->set_what("cannot find ']'");
                  return false;
              }
            }
          } last: break;
        }  // end switch
      } break;  // end case '%'
    }  // end switch
  }

  return true;
}